

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.h
# Opt level: O2

void __thiscall
chrono::ChLinkLockPointLine::ChLinkLockPointLine
          (ChLinkLockPointLine *this,ChLinkLockPointLine *param_1)

{
  ChLinkLock::ChLinkLock(&this->super_ChLinkLock,&param_1->super_ChLinkLock);
  (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
  super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkLock_01163a60;
  return;
}

Assistant:

class ChApi ChLinkLockPointLine : public ChLinkLock {
  public:
    ChLinkLockPointLine() { ChangeLinkType(LinkType::POINTLINE); }

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLinkLockPointLine* Clone() const override { return new ChLinkLockPointLine(*this); }

    /// Lock the joint.
    /// If enabled (lock = true) this effectively converts this joint into a weld joint.
    /// If lock = false, the joint reverts to its original degrees of freedom.
    void Lock(bool lock);
}